

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<char>::addAll<kj::StringPtr>(Vector<char> *this,StringPtr *container)

{
  char *__src;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *newSize;
  RemoveConst<char> *__dest;
  
  __src = (container->content).ptr;
  sVar1 = (container->content).size_;
  pcVar2 = (this->builder).ptr;
  pcVar4 = (this->builder).pos + (sVar1 - (long)pcVar2) + -1;
  pcVar3 = (this->builder).endPtr;
  pcVar5 = pcVar3 + -(long)pcVar2;
  if (pcVar5 < pcVar4) {
    newSize = (char *)0x4;
    if (pcVar3 != pcVar2) {
      newSize = (char *)((long)pcVar5 * 2);
    }
    if (newSize < pcVar4) {
      newSize = pcVar4;
    }
    setCapacity(this,(size_t)newSize);
  }
  __dest = (this->builder).pos;
  if (__src != __src + (sVar1 - 1)) {
    memcpy(__dest,__src,sVar1 - 1);
    __dest = __dest + (sVar1 - 1);
  }
  (this->builder).pos = __dest;
  return;
}

Assistant:

inline void addAll(Container&& container) {
    addAll(container.begin(), container.end());
  }